

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O3

void test_aad96_ciphersuite(ptls_cipher_suite_t *cs1,ptls_cipher_suite_t *cs2)

{
  int iVar1;
  ptls_aead_context_t *ppVar2;
  size_t sVar3;
  long in_RDX;
  size_t sVar4;
  char enc [256];
  char dec [256];
  uint local_258 [8];
  uint local_238 [64];
  uint local_138 [66];
  
  ppVar2 = ptls_aead_new((ptls_aead_algorithm_t *)cs1,(ptls_hash_algorithm_t *)cs2,1,
                         "012345678901234567890123456789012345678901234567",(char *)0x0);
  if (ppVar2 == (ptls_aead_context_t *)0x0) {
    __assert_fail("c != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/picotls.c",
                  0x159,"void test_aad96_ciphersuite(ptls_cipher_suite_t *, ptls_cipher_suite_t *)")
    ;
  }
  (*ppVar2->do_get_iv)(ppVar2,local_238);
  local_238[0] = local_238[0] ^ 0xd4c3b2a1;
  (*ppVar2->do_set_iv)(ppVar2,local_238);
  (*ppVar2->do_encrypt)
            (ppVar2,local_238,"hello world",0xb,0x7b,"my true aad",0xb,
             (ptls_aead_supplementary_encryption_t *)0x0);
  sVar4 = ppVar2->algo->tag_size;
  (*ppVar2->dispose_crypto)(ppVar2);
  free(ppVar2);
  ppVar2 = ptls_aead_new(*(ptls_aead_algorithm_t **)(in_RDX + 8),
                         *(ptls_hash_algorithm_t **)(in_RDX + 0x10),0,
                         "012345678901234567890123456789012345678901234567",(char *)0x0);
  if (ppVar2 != (ptls_aead_context_t *)0x0) {
    sVar4 = sVar4 + 0xb;
    (*ppVar2->do_get_iv)(ppVar2,local_138);
    local_138[0] = local_138[0] ^ 0xd4c3b2a1;
    (*ppVar2->do_set_iv)(ppVar2,local_138);
    sVar3 = (*ppVar2->do_decrypt)(ppVar2,local_138,local_238,sVar4,0x7b,"my true aad",0xb);
    (*ppVar2->do_get_iv)(ppVar2,local_258);
    local_258[0] = local_258[0] ^ 0xd4c3b2a1;
    (*ppVar2->do_set_iv)(ppVar2,local_258);
    _ok((uint)(sVar3 == 0xb),"%s %d",
        "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/picotls.c",0x165);
    iVar1 = bcmp("hello world",local_138,sVar3);
    _ok((uint)(iVar1 == 0),"%s %d",
        "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/picotls.c",0x166);
    (*ppVar2->do_get_iv)(ppVar2,local_258);
    local_258[0] = local_258[0] ^ 0xe5c4b3a2;
    (*ppVar2->do_set_iv)(ppVar2,local_258);
    sVar3 = (*ppVar2->do_decrypt)(ppVar2,local_138,local_238,sVar4,0x7b,"my true aad",0xb);
    (*ppVar2->do_get_iv)(ppVar2,local_258);
    local_258[0] = local_258[0] ^ 0xe5c4b3a2;
    (*ppVar2->do_set_iv)(ppVar2,local_258);
    _ok((uint)(sVar3 == 0xffffffffffffffff),"%s %d",
        "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/picotls.c",0x16b);
    (*ppVar2->do_get_iv)(ppVar2,local_258);
    local_258[0] = local_258[0] ^ 0xd4c3b2a1;
    (*ppVar2->do_set_iv)(ppVar2,local_258);
    sVar4 = (*ppVar2->do_decrypt)(ppVar2,local_138,local_238,sVar4,0x7b,"my true aad",0xb);
    _ok((uint)(sVar4 == 0xb),"%s %d",
        "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/picotls.c",0x16f);
    iVar1 = bcmp("hello world",local_138,sVar4);
    _ok((uint)(iVar1 == 0),"%s %d",
        "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/picotls.c",0x170);
    (*ppVar2->dispose_crypto)(ppVar2);
    free(ppVar2);
    return;
  }
  __assert_fail("c != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/picotls.c",0x160,
                "void test_aad96_ciphersuite(ptls_cipher_suite_t *, ptls_cipher_suite_t *)");
}

Assistant:

static void test_aad96_ciphersuite(ptls_cipher_suite_t *cs1, ptls_cipher_suite_t *cs2)
{
    const char *traffic_secret = "012345678901234567890123456789012345678901234567", *src = "hello world", *aad = "my true aad";
    ptls_aead_context_t *c;
    char enc[256], dec[256];
    uint8_t seq32[4] = {0xa1, 0xb2, 0xc3, 0xd4};
    uint8_t seq32_bad[4] = {0xa2, 0xb3, 0xc4, 0xe5};
    size_t enclen, declen;

    /* encrypt */
    c = ptls_aead_new(cs1->aead, cs1->hash, 1, traffic_secret, NULL);
    assert(c != NULL);
    ptls_aead_xor_iv(c, seq32, sizeof(seq32));
    enclen = ptls_aead_encrypt(c, enc, src, strlen(src), 123, aad, strlen(aad));
    ptls_aead_free(c);

    /* decrypt */
    c = ptls_aead_new(cs2->aead, cs2->hash, 0, traffic_secret, NULL);
    assert(c != NULL);
    /* test first decryption */
    ptls_aead_xor_iv(c, seq32, sizeof(seq32));
    declen = ptls_aead_decrypt(c, dec, enc, enclen, 123, aad, strlen(aad));
    ptls_aead_xor_iv(c, seq32, sizeof(seq32));
    ok(declen == strlen(src));
    ok(memcmp(src, dec, declen) == 0);
    /* test that setting the wrong IV creates an error */
    ptls_aead_xor_iv(c, seq32_bad, sizeof(seq32_bad));
    declen = ptls_aead_decrypt(c, dec, enc, enclen, 123, aad, strlen(aad));
    ptls_aead_xor_iv(c, seq32_bad, sizeof(seq32_bad));
    ok(declen == SIZE_MAX);
    /* test second decryption with correct IV to verify no side effect */
    ptls_aead_xor_iv(c, seq32, sizeof(seq32));
    declen = ptls_aead_decrypt(c, dec, enc, enclen, 123, aad, strlen(aad));
    ok(declen == strlen(src));
    ok(memcmp(src, dec, declen) == 0);
    ptls_aead_free(c);
}